

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

TriangleMesh *
pbrt::Triangle::CreateMesh
          (Transform *renderFromObject,bool reverseOrientation,ParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  TriangleMesh *pTVar3;
  ulong uVar4;
  long lVar5;
  char *message;
  pointer args;
  bool bVar6;
  bool reverseOrientation_local;
  string local_f8;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> P;
  vector<int,_std::allocator<int>_> vi;
  int local_a4;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> S;
  vector<int,_std::allocator<int>_> faceIndices;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> N;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uvs;
  Allocator alloc_local;
  
  reverseOrientation_local = reverseOrientation;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"indices",(allocator<char> *)&P);
  ParameterDictionary::GetIntArray(&vi,parameters,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"P",(allocator<char> *)&uvs);
  ParameterDictionary::GetPoint3fArray(&P,parameters,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"uv",(allocator<char> *)&S)
  ;
  ParameterDictionary::GetPoint2fArray(&uvs,parameters,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  if (vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
      vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
    if ((long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x24) {
      local_f8._M_dataplus._M_p = (pointer)0x100000000;
      local_f8._M_string_length._0_4_ = 2;
      std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                ((vector<int,std::allocator<int>> *)&vi,&local_f8);
      goto LAB_002b7940;
    }
    message = "Vertex indices \"indices\" must be provided with triangle mesh.";
  }
  else {
    uVar4 = (long)vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start >> 2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    if (SUB168(auVar1 % ZEXT816(3),0) != 0) {
      local_f8._M_dataplus._M_p._0_4_ = (int)uVar4;
      S.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = SUB164(auVar1 % ZEXT816(3),0);
      Error<int,int>(loc,"Number of vertex indices %d not a multiple of 3. Discarding %d excess.",
                     (int *)&local_f8,(int *)&S);
      lVar5 = (long)vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_finish -
              (long)vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start;
      for (; (ulong)(lVar5 >> 2) % 3 != 0; lVar5 = lVar5 + -4) {
        vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish + -1;
      }
    }
LAB_002b7940:
    if (P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
        super__Vector_impl_data._M_start !=
        P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((uvs.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           uvs.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         ((long)uvs.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)uvs.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 !=
          ((long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0xc)) {
        Error(loc,"Number of \"uv\"s for triangle mesh must match \"P\"s. Discarding uvs.");
        std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
        _M_assign_aux<pbrt::Point2<float>const*>
                  ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&uvs,0,0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"S",(allocator<char> *)&N);
      ParameterDictionary::GetVector3fArray(&S,parameters,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      if (((pointer)CONCAT44(S.
                             super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             S.
                             super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_) !=
           S.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         ((long)S.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)CONCAT44(S.
                         super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         S.
                         super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_) !=
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start)) {
        Error(loc,"Number of \"S\"s for triangle mesh must match \"P\"s. Discarding \"S\"s.");
        std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::operator=
                  (&S,(initializer_list<pbrt::Vector3<float>_>)ZEXT816(0));
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"N",(allocator<char> *)&faceIndices);
      ParameterDictionary::GetNormal3fArray(&N,parameters,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      if ((N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         ((long)N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start !=
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start)) {
        Error(loc,"Number of \"N\"s for triangle mesh must match \"P\"s. Discarding \"N\"s.");
        std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::operator=
                  (&N,(initializer_list<pbrt::Normal3<float>_>)ZEXT816(0));
      }
      uVar4 = ((long)P.
                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc;
      lVar5 = (long)vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_finish -
              (long)vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start >> 2;
      args = vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
      while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
        if (uVar4 <= (ulong)(long)*args) {
          local_f8._M_dataplus._M_p._0_4_ = (int)uVar4;
          Error<int&,int>(loc,
                          "trianglemesh has out of-bounds vertex index %d (%d \"P\" values were given. Discarding this mesh."
                          ,args,(int *)&local_f8);
          pTVar3 = (TriangleMesh *)0x0;
          goto LAB_002b7be6;
        }
        args = args + 1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"faceIndices",(allocator<char> *)&local_a4);
      ParameterDictionary::GetIntArray(&faceIndices,parameters,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      if (faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        lVar5 = (long)faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)vi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2;
        if (lVar5 != SUB168(auVar2 / ZEXT816(3),0)) {
          local_f8._M_dataplus._M_p._0_4_ = (int)lVar5;
          local_a4 = SUB164(auVar2 / ZEXT816(3),0);
          Error<int,int>(loc,
                         "Number of face indices %d does not match number of triangles %d. Discarding face indices."
                         ,(int *)&local_f8,&local_a4);
          std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                    ((vector<int,std::allocator<int>> *)&faceIndices,0,0);
        }
      }
      pTVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
                         (&alloc_local,renderFromObject,&reverseOrientation_local,&vi,&P,&S,&N,&uvs,
                          &faceIndices);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&faceIndices.super__Vector_base<int,_std::allocator<int>_>);
LAB_002b7be6:
      std::_Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~_Vector_base
                (&N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                );
      std::_Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::~_Vector_base
                (&S.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                );
      goto LAB_002b7c10;
    }
    message = "Vertex positions \"P\" must be provided with triangle mesh.";
  }
  Error(loc,message);
  pTVar3 = (TriangleMesh *)0x0;
LAB_002b7c10:
  std::_Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~_Vector_base
            (&uvs.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>);
  std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~_Vector_base
            (&P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vi.super__Vector_base<int,_std::allocator<int>_>);
  return pTVar3;
}

Assistant:

TriangleMesh *Triangle::CreateMesh(const Transform *renderFromObject,
                                   bool reverseOrientation,
                                   const ParameterDictionary &parameters,
                                   const FileLoc *loc, Allocator alloc) {
    std::vector<int> vi = parameters.GetIntArray("indices");
    std::vector<Point3f> P = parameters.GetPoint3fArray("P");
    std::vector<Point2f> uvs = parameters.GetPoint2fArray("uv");

    if (vi.empty()) {
        if (P.size() == 3)
            vi = {0, 1, 2};
        else {
            Error(loc, "Vertex indices \"indices\" must be provided with "
                       "triangle mesh.");
            return {};
        }
    } else if ((vi.size() % 3) != 0u) {
        Error(loc,
              "Number of vertex indices %d not a multiple of 3. Discarding %d "
              "excess.",
              int(vi.size()), int(vi.size() % 3));
        while ((vi.size() % 3) != 0u)
            vi.pop_back();
    }

    if (P.empty()) {
        Error(loc, "Vertex positions \"P\" must be provided with triangle mesh.");
        return {};
    }

    if (!uvs.empty() && uvs.size() != P.size()) {
        Error(loc, "Number of \"uv\"s for triangle mesh must match \"P\"s. "
                   "Discarding uvs.");
        uvs = {};
    }

    std::vector<Vector3f> S = parameters.GetVector3fArray("S");
    if (!S.empty() && S.size() != P.size()) {
        Error(loc, "Number of \"S\"s for triangle mesh must match \"P\"s. "
                   "Discarding \"S\"s.");
        S = {};
    }
    std::vector<Normal3f> N = parameters.GetNormal3fArray("N");
    if (!N.empty() && N.size() != P.size()) {
        Error(loc, "Number of \"N\"s for triangle mesh must match \"P\"s. "
                   "Discarding \"N\"s.");
        N = {};
    }

    for (size_t i = 0; i < vi.size(); ++i)
        if (vi[i] >= P.size()) {
            Error(loc,
                  "trianglemesh has out of-bounds vertex index %d (%d \"P\" "
                  "values were given. Discarding this mesh.",
                  vi[i], (int)P.size());
            return {};
        }

    std::vector<int> faceIndices = parameters.GetIntArray("faceIndices");
    if (!faceIndices.empty() && faceIndices.size() != vi.size() / 3) {
        Error(loc,
              "Number of face indices %d does not match number of triangles %d. "
              "Discarding face indices.",
              int(faceIndices.size()), int(vi.size() / 3));
        faceIndices = {};
    }

    return alloc.new_object<TriangleMesh>(
        *renderFromObject, reverseOrientation, std::move(vi), std::move(P), std::move(S),
        std::move(N), std::move(uvs), std::move(faceIndices));
}